

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_SUNMemory.cpp
# Opt level: O3

MemoryHelper * __thiscall
amrex::sundials::MemoryHelper::operator=(MemoryHelper *this,MemoryHelper *rhs)

{
  SUNMemoryHelper p_Var1;
  Context *pCVar2;
  
  p_Var1 = this->helper;
  this->helper = rhs->helper;
  rhs->helper = p_Var1;
  pCVar2 = this->sunctx;
  this->sunctx = rhs->sunctx;
  rhs->sunctx = pCVar2;
  return this;
}

Assistant:

MemoryHelper& MemoryHelper::operator=(MemoryHelper rhs)
{
    std::swap(helper, rhs.helper);
    std::swap(sunctx, rhs.sunctx);
    return *this;
}